

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O1

uint32_t nexttoken(char **pp,int allowlit,int allowany)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  uint extraout_EDX;
  uint uVar11;
  uint uVar12;
  char *__s;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  uint *puVar18;
  long lVar19;
  uint32_t uVar20;
  char *pcVar21;
  ulong uVar22;
  bool bVar23;
  char *r;
  
  __s = *pp;
  if (__s == (char *)0x0) {
    allowany = 0;
  }
  else {
    pcVar5 = strchr(__s,0x20);
    if (pcVar5 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar5 + 1;
      *pcVar5 = '\0';
    }
    *pp = pcVar9;
    if (allowlit != 0) {
      iVar3 = strncmp(__s,"IRFPM_",6);
      if (iVar3 == 0) {
        pcVar5 = "FLOOR";
        uVar17 = 0;
        do {
          pcVar14 = __s + 6;
          iVar3 = strcmp(pcVar5,__s + 6);
          uVar13 = (uint)pcVar14;
          iVar8 = (int)pcVar9;
          if (iVar3 == 0) {
            return (uint32_t)uVar17;
          }
          uVar17 = (ulong)((uint32_t)uVar17 + 1);
          pcVar5 = irfpm_names[uVar17];
        } while (pcVar5 != (char *)0x0);
        goto LAB_0010b07c;
      }
      iVar3 = strncmp(__s,"IRFL_",5);
      if (iVar3 == 0) {
        pcVar5 = "STR_LEN";
        uVar17 = 0;
        do {
          pcVar14 = __s + 5;
          iVar3 = strcmp(pcVar5,__s + 5);
          uVar13 = (uint)pcVar14;
          iVar8 = (int)pcVar9;
          if (iVar3 == 0) {
            return (uint32_t)uVar17;
          }
          uVar17 = (ulong)((uint32_t)uVar17 + 1);
          pcVar5 = irfield_names[uVar17];
        } while (pcVar5 != (char *)0x0);
        goto LAB_0010b07c;
      }
      iVar3 = strncmp(__s,"IRCALL_",7);
      if (iVar3 == 0) {
        pcVar5 = "lj_str_cmp";
        uVar17 = 0;
        do {
          pcVar14 = __s + 7;
          iVar3 = strcmp(pcVar5,__s + 7);
          uVar13 = (uint)pcVar14;
          iVar8 = (int)pcVar9;
          if (iVar3 == 0) {
            return (uint32_t)uVar17;
          }
          uVar17 = (ulong)((uint32_t)uVar17 + 1);
          pcVar5 = ircall_names[uVar17];
        } while (pcVar5 != (char *)0x0);
        goto LAB_0010b07c;
      }
      uVar13 = 0x113804;
      iVar3 = strncmp(__s,"IRCONV_",7);
      if (iVar3 == 0) {
        pcVar14 = "NIL";
        pcVar5 = __s + 7;
        pcVar15 = (char *)0x5f;
        pcVar6 = strchr(pcVar5,0x5f);
        pcVar9 = pcVar6 + 1;
        uVar17 = 0;
        sVar10 = (long)pcVar6 - (long)pcVar5;
        pcVar21 = pcVar5;
        do {
          bVar23 = true;
          if ((pcVar6 != (char *)0x0) &&
             (pcVar15 = pcVar5, iVar3 = strncmp(pcVar14,pcVar5,(long)pcVar6 - (long)pcVar5),
             iVar3 == 0)) {
            bVar23 = false;
            pcVar15 = pcVar9;
            iVar3 = strcmp("NIL",pcVar9);
            uVar22 = 0;
            while (iVar3 != 0) {
              uVar22 = (ulong)((int)uVar22 + 1);
              bVar23 = irt_names[uVar22] == (char *)0x0;
              if (bVar23) goto LAB_0010b05c;
              pcVar15 = pcVar9;
              iVar3 = strcmp(irt_names[uVar22],pcVar9);
            }
            pcVar21 = (char *)(ulong)(uint)((int)uVar17 * 0x20 + (int)uVar22);
          }
LAB_0010b05c:
          uVar13 = (uint)pcVar15;
          iVar8 = (int)sVar10;
          if (!bVar23) {
            return (uint32_t)pcVar21;
          }
          uVar17 = (ulong)((int)uVar17 + 1);
          pcVar14 = irt_names[uVar17];
        } while (pcVar14 != (char *)0x0);
        goto LAB_0010b07c;
      }
      if ((byte)(*__s - 0x30U) < 10) {
        uVar4 = CONCAT31((int3)((uint)iVar3 >> 8),*__s);
        iVar8 = uVar4 - 0x30;
        uVar20 = 0;
        if ((byte)iVar8 < 10) {
          uVar20 = 0;
          do {
            uVar20 = (uint)(byte)((char)uVar4 - 0x30) + uVar20 * 10;
            pbVar1 = (byte *)(__s + 1);
            uVar4 = (uint)*pbVar1;
            __s = __s + 1;
            iVar8 = *pbVar1 - 0x30;
          } while ((byte)iVar8 < 10);
        }
        if ((char)uVar4 == '\0') {
          return uVar20;
        }
        goto LAB_0010b07c;
      }
    }
    if ((allowany == 0) || (iVar3 = strcmp("any",__s), iVar3 != 0)) {
      pcVar5 = "LT";
      uVar17 = 0;
      do {
        pcVar14 = __s;
        iVar3 = strcmp(pcVar5,__s);
        uVar13 = (uint)pcVar14;
        iVar8 = (int)pcVar9;
        if (iVar3 == 0) {
          return (uint32_t)uVar17;
        }
        uVar17 = (ulong)((uint32_t)uVar17 + 1);
        pcVar5 = ir_names[uVar17];
      } while (pcVar5 != (char *)0x0);
LAB_0010b07c:
      nexttoken_cold_1();
      if ((iVar8 == 0) || (uVar20 = 0, 0x1f < extraout_EDX && (extraout_EDX & 0x1f) != 0)) {
        memset(__s,0xff,(ulong)uVar13 * 4 + 4);
        uVar17 = (ulong)nkeys;
        if (uVar17 != 0) {
          bVar2 = (byte)extraout_EDX;
          lVar19 = 0;
          do {
            uVar4 = *(uint *)((long)foldkeys + lVar19);
            uVar11 = uVar4 & 0xffffff;
            bVar7 = (byte)(extraout_EDX >> 5);
            if (iVar8 == 0) {
              uVar11 = (uVar11 << (bVar7 & 0x1f)) - uVar11 << (bVar2 & 0x1f);
            }
            else {
              uVar11 = (uVar11 << (bVar7 & 0x1f) | uVar11 >> 0x20 - (bVar7 & 0x1f)) - uVar11;
              uVar11 = uVar11 << (bVar2 & 0x1f) | uVar11 >> 0x20 - (bVar2 & 0x1f);
            }
            uVar22 = (ulong)uVar11 % (ulong)uVar13;
            if (*(int *)(__s + uVar22 * 4) == -1) {
              puVar18 = (uint *)(__s + uVar22 * 4);
            }
            else {
              uVar16 = (uint)uVar22;
              puVar18 = (uint *)(__s + uVar22 * 4 + 4);
              uVar11 = *puVar18;
              if (uVar11 != 0xffffffff) {
                if (uVar13 - 1 <= uVar16) {
                  return 0;
                }
                if (*(int *)(__s + (long)(int)uVar16 * 4 + 8) != -1) {
                  return 0;
                }
                uVar12 = uVar11 & 0xffffff;
                if (iVar8 == 0) {
                  uVar12 = (uVar12 << (bVar7 & 0x1f)) - uVar12 << (bVar2 & 0x1f);
                }
                else {
                  uVar12 = (uVar12 << (bVar7 & 0x1f) | uVar12 >> 0x20 - (bVar7 & 0x1f)) - uVar12;
                  uVar12 = uVar12 << (bVar2 & 0x1f) | uVar12 >> 0x20 - (bVar2 & 0x1f);
                }
                if (uVar12 % uVar13 != uVar16 + 1) {
                  return 0;
                }
                *(uint *)(__s + (long)(int)uVar16 * 4 + 8) = uVar11;
              }
            }
            *puVar18 = uVar4;
            lVar19 = lVar19 + 4;
          } while (uVar17 << 2 != lVar19);
        }
        uVar20 = 1;
      }
      return uVar20;
    }
  }
  return allowany;
}

Assistant:

static uint32_t nexttoken(char **pp, int allowlit, int allowany)
{
  char *p = *pp;
  if (p) {
    uint32_t i;
    char *q = strchr(p, ' ');
    if (q) *q++ = '\0';
    *pp = q;
    if (allowlit && !strncmp(p, "IRFPM_", 6)) {
      for (i = 0; irfpm_names[i]; i++)
	if (!strcmp(irfpm_names[i], p+6))
	  return i;
    } else if (allowlit && !strncmp(p, "IRFL_", 5)) {
      for (i = 0; irfield_names[i]; i++)
	if (!strcmp(irfield_names[i], p+5))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCALL_", 7)) {
      for (i = 0; ircall_names[i]; i++)
	if (!strcmp(ircall_names[i], p+7))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCONV_", 7)) {
      for (i = 0; irt_names[i]; i++) {
	const char *r = strchr(p+7, '_');
	if (r && !strncmp(irt_names[i], p+7, r-(p+7))) {
	  uint32_t j;
	  for (j = 0; irt_names[j]; j++)
	    if (!strcmp(irt_names[j], r+1))
	      return (i << 5) + j;
	}
      }
    } else if (allowlit && *p >= '0' && *p <= '9') {
      for (i = 0; *p >= '0' && *p <= '9'; p++)
	i = i*10 + (*p - '0');
      if (*p == '\0')
	return i;
    } else if (allowany && !strcmp("any", p)) {
      return allowany;
    } else {
      for (i = 0; ir_names[i]; i++)
	if (!strcmp(ir_names[i], p))
	  return i;
    }
    fprintf(stderr, "Error: bad fold definition token \"%s\" at line %d\n", p, lineno);
    exit(1);
  }
  return 0;
}